

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

double fas154(double *b,int pq,void *params)

{
  double *phi_00;
  double *theta_00;
  double *A_00;
  double *P_00;
  double *V_00;
  double dVar1;
  double dVar2;
  alik_object obj;
  double *V;
  double *P;
  double *A;
  double *theta;
  double *phi;
  int iter;
  int nit;
  int iupd;
  int N;
  int ifault;
  int np;
  int i;
  int ir;
  int iq;
  int ip;
  double delta;
  double sumlog;
  double ssq;
  double value;
  void *params_local;
  double *pdStack_38;
  int pq_local;
  double *b_local;
  
  delta = 0.0;
  sumlog = 0.0;
  ssq = 0.0;
  ir = *params;
  i = *(int *)((long)params + 8);
  np = *(int *)((long)params + 0xc);
  nit = *(int *)((long)params + 0x18);
  N = (np * (np + 1)) / 2;
  value = (double)params;
  params_local._4_4_ = pq;
  pdStack_38 = b;
  phi_00 = (double *)malloc((long)np << 3);
  theta_00 = (double *)malloc((long)np << 3);
  A_00 = (double *)malloc((long)np << 3);
  P_00 = (double *)malloc((long)N << 3);
  V_00 = (double *)malloc((long)N << 3);
  for (ifault = 0; ifault < ir; ifault = ifault + 1) {
    phi_00[ifault] = pdStack_38[ifault];
  }
  for (ifault = ir; ifault < np; ifault = ifault + 1) {
    phi_00[ifault] = 0.0;
  }
  for (ifault = 0; ifault < i; ifault = ifault + 1) {
    theta_00[ifault] = pdStack_38[ifault + ir];
  }
  for (ifault = i; ifault < np; ifault = ifault + 1) {
    theta_00[ifault] = 0.0;
  }
  if (*(int *)((long)params + 0x1c) == 1) {
    for (ifault = 0; ifault < nit; ifault = ifault + 1) {
      *(double *)((long)params + (long)ifault * 8 + 0x680) =
           *(double *)((long)params + (long)(nit * 2 + ifault) * 8 + 0x680) - pdStack_38[ir + i];
    }
  }
  iter = 0;
  if ((ir == 1) && (i == 0)) {
    *V_00 = 1.0;
    *A_00 = 0.0;
    *P_00 = 1.0 / (-*phi_00 * *phi_00 + 1.0);
  }
  else {
    iter = 1;
    iupd = starma(ir,i,phi_00,theta_00,A_00,P_00,V_00);
  }
  phi._4_4_ = 0;
  _iq = 0x3f50624dd2f1a9fc;
  karma(ir,i,phi_00,theta_00,A_00,P_00,V_00,nit,(double *)((long)params + 0x680),
        (double *)((long)params + (long)nit * 8 + 0x680),&delta,&sumlog,iter,0.001,(int *)&phi,
        (int *)((long)&phi + 4));
  *(double *)((long)params + 0x30) = sumlog;
  dVar1 = delta / (double)(int)phi;
  dVar2 = log(sumlog / (double)(int)phi);
  ssq = (dVar1 + dVar2) * 0.5;
  *(double *)((long)params + 0x38) = ssq;
  free(phi_00);
  free(theta_00);
  free(A_00);
  free(P_00);
  free(V_00);
  return ssq;
}

Assistant:

double fas154(double *b,int pq,void *params) {
	double value,ssq,sumlog,delta;
	int ip, iq, ir,i,np,ifault,N,iupd,nit,iter;
	double *phi, *theta, *A,*P,*V;

	value = ssq = sumlog = 0.0;
	alik_object obj = (alik_object)params;

	ip = obj->p;
	iq = obj->q;
	ir = obj->r;
	N = obj->N;
	np = (ir * (ir + 1)) / 2;

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	A = (double*)malloc(sizeof(double)* ir);
	P = (double*)malloc(sizeof(double)* np);
	V = (double*)malloc(sizeof(double)* np);
	//bt = (double*)malloc(sizeof(double)* (ip+iq));
	/*
	for (i = 0; i < ip + iq; ++i) {
		bt[i] = b[i];
	}

	pdlreg(ip, bt, b);
	pdlreg(iq, bt + ip, b + ip);
	*/
	for (i = 0; i < ip; ++i) {
		phi[i] = b[i];
	}
	for (i = ip; i < ir; ++i) {
		phi[i] = 0.0;
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = b[i+ip];
	}
	for (i = iq; i < ir; ++i) {
		theta[i] = 0.0;
	}
	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[i] = obj->x[2 * N + i] - b[ip + iq];
		}
	}

	iupd = 0;

	if (ip == 1 && iq == 0) {
		*V = 1.0;
		*A = 0.0;
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		iupd = 1;
		ifault = starma(ip, iq, phi, theta, A, P, V);
	}
	
	nit = 0;
	delta = 0.001;
	//mdisplay(P, 1, np);
	karma(ip, iq, phi, theta, A, P, V, N, obj->x, obj->x + N, &sumlog, &ssq, iupd, delta,&iter, &nit);
	obj->ssq = ssq;
	//mdisplay(phi, 1, ip);
	value = 0.5 * (sumlog/(double)iter + log(ssq/(double) iter));
	obj->loglik = value;

	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(A);
	free(P);
	free(V);
	//free(bt);
	return value;
}